

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Command * __thiscall Command::execute(Command *this)

{
  pointer pbVar1;
  int iVar2;
  pointer piVar3;
  iterator iVar4;
  _Alloc_hider _Var5;
  string *arg;
  pointer pbVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double __x_00;
  double dVar7;
  double __x_01;
  double __x_02;
  int x_1;
  int x;
  stringstream a;
  int local_1d0;
  int local_1cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  undefined8 local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  string local_1a8 [4];
  ios_base local_128 [264];
  
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&this->name,"p");
  if (iVar2 == 0) {
    pbVar1 = (this->args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    dVar7 = extraout_XMM0_Qa;
    for (pbVar6 = (this->args).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1)
    {
      dVar7 = log(dVar7);
    }
    return this;
  }
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&this->name,"l");
  if (iVar2 == 0) {
    pbVar1 = (this->args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    dVar7 = extraout_XMM0_Qa_00;
    for (pbVar6 = (this->args).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1)
    {
      dVar7 = log(dVar7);
    }
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"\n","");
    log(__x_01);
  }
  else {
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&this->name,"i");
    if (iVar2 == 0) {
      local_1c0 = 0;
      local_1b8._M_local_buf[0] = '\0';
      local_1c8 = &local_1b8;
      std::operator>>((istream *)&std::cin,(string *)&local_1c8);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)local_1a8,(string *)&local_1c8,_S_out|_S_in);
      std::istream::operator>>((istream *)local_1a8,&local_1d0);
      local_1cc = local_1d0;
      iVar4._M_current =
           (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->stack,iVar4,&local_1cc);
      }
      else {
        *iVar4._M_current = local_1d0;
        (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar4._M_current + 1;
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base(local_128);
      if (local_1c8 == &local_1b8) {
        return this;
      }
      local_1a8[0].field_2._0_8_ =
           CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]);
      _Var5._M_p = (pointer)local_1c8;
      goto LAB_00106ef3;
    }
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&this->name,"s");
    if (iVar2 == 0) {
      piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar2 = piVar3[-1] - piVar3[-2];
LAB_00106e88:
      iVar4._M_current = piVar3 + -2;
      (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar4._M_current;
      local_1a8[0]._M_dataplus._M_p._0_4_ = iVar2;
      if (iVar4._M_current !=
          (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *iVar4._M_current = iVar2;
        (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar3 + -1;
        return this;
      }
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->stack,iVar4,(int *)local_1a8);
      return this;
    }
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&this->name,"a");
    if (iVar2 == 0) {
      piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar2 = piVar3[-2] + piVar3[-1];
      goto LAB_00106e88;
    }
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&this->name,"d");
    if (iVar2 == 0) {
      piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar2 = piVar3[-1] / piVar3[-2];
      (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar3 + -2;
LAB_00106f4d:
      pushStack(this,iVar2);
      return this;
    }
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&this->name,"m");
    if (iVar2 == 0) {
      piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar2 = piVar3[-2] * piVar3[-1];
      (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar3 + -2;
      goto LAB_00106f4d;
    }
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&this->name,"b");
    if (iVar2 == 0) {
      piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar2 = piVar3[-1];
      (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar3 + -1;
      pushStack(this,iVar2);
      goto LAB_00106f4d;
    }
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&this->name,"t");
    if (iVar2 == 0) {
      std::__cxx11::stringstream::stringstream
                ((stringstream *)local_1a8,
                 (string *)
                 (this->args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,_S_out|_S_in);
      std::istream::operator>>((istream *)local_1a8,(int *)&local_1c8);
      pushStack(this,(int)local_1c8);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base(local_128);
      return this;
    }
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&this->name,"P");
    if (iVar2 == 0) {
      piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar2 = piVar3[-1];
      (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar3 + -1;
      std::__cxx11::to_string(local_1a8,iVar2);
      log(__x_02);
      _Var5._M_p = local_1a8[0]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p == &local_1a8[0].field_2) {
        return this;
      }
      goto LAB_00106ef3;
    }
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&this->name,"L");
    if (iVar2 != 0) {
      return this;
    }
    piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar2 = piVar3[-1];
    (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3 + -1;
    std::__cxx11::to_string(local_1a8,iVar2);
    log(__x);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"\n","");
    log(__x_00);
  }
  _Var5._M_p = local_1a8[0]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p == &local_1a8[0].field_2) {
    return this;
  }
LAB_00106ef3:
  operator_delete(_Var5._M_p,local_1a8[0].field_2._0_8_ + 1);
  return this;
}

Assistant:

Command& execute() {
            if (name == "p")
                for (const string& arg : args) log(arg);
            else if (name == "l") {
                for (const string& arg : args) log(arg);
                log("\n");
            }
            else if (name == "i") {
                string b;
                cin >> b;
                stringstream a(b);
                int x;
                a >> x;
                pushStack(x);
            } else if (name == "s")
                pushStack(popStack() - popStack());
            else if (name == "a")
                pushStack(popStack() + popStack());
            else if (name == "d")
                pushStack(popStack() / popStack());
            else if (name == "m")
                pushStack(popStack() * popStack());
            else if (name == "b") {
                int x = popStack();
                pushStack(x);
                pushStack(x);
            }
            else if (name == "t") {
                stringstream a(args[0]);
                int x;
                a >> x;
                pushStack(x);
            } else if (name == "P")
                log(to_string(popStack()));
            else if (name == "L") {
                log(to_string(popStack()));
                log("\n");
            }
            return *this;
        }